

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void gflags::AddXMLTag(string *r,char *tag,string *txt)

{
  undefined8 uVar1;
  undefined8 in_R9;
  gflags *this;
  gflags local_40 [32];
  string *local_20;
  string *txt_local;
  char *tag_local;
  string *r_local;
  
  this = local_40;
  local_20 = txt;
  txt_local = (string *)tag;
  tag_local = (char *)r;
  XMLText(this,txt);
  uVar1 = std::__cxx11::string::c_str();
  StringAppendF(r,"<%s>%s</%s>",tag,uVar1,txt_local,in_R9,this);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

static void AddXMLTag(string* r, const char* tag, const string& txt) {
  StringAppendF(r, "<%s>%s</%s>", tag, XMLText(txt).c_str(), tag);
}